

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * PololuThread(void *pParam)

{
  int iVar1;
  int local_fc;
  int local_f8;
  int value;
  int pws [24];
  int selectedchannels [24];
  int local_2c;
  int err;
  int res;
  int id;
  POLOLU *pPololu;
  void *pParam_local;
  
  err = 0;
  local_2c = 0;
  local_fc = 0;
  do {
    if (addrsPololu[err] == pParam) {
      memset(valuesPololu,0,0x60);
      mSleep((long)*(int *)((long)pParam + 0x5e8));
      do {
        EnterCriticalSection(PololuCS + err);
        memcpy(pws + 0x16,selectedchannelsPololu + err,0x60);
        memcpy(&local_f8,pwsPololu + err,0x60);
        LeaveCriticalSection(PololuCS + err);
        iVar1 = SetAllPWMsPololu((POLOLU *)pParam,pws + 0x16,&local_f8);
        if (iVar1 != 0) {
          local_2c = iVar1;
        }
        mSleep(10);
        if (*(int *)((long)pParam + 0x1188) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1188),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x1188)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x118c) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x118c),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x118c)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x1190) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1190),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x1190)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x1194) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1194),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x1194)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x1198) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1198),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x1198)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x119c) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x119c),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x119c)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        if (*(int *)((long)pParam + 0x11a0) != -1) {
          local_fc = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x11a0),&local_fc);
          if (iVar1 != 0) {
            local_2c = iVar1;
          }
          mSleep(10);
          EnterCriticalSection(PololuCS + err);
          valuesPololu[err][*(int *)((long)pParam + 0x11a0)] = local_fc;
          resPololu[err] = local_2c;
          LeaveCriticalSection(PololuCS + err);
        }
        EnterCriticalSection(PololuCS + err);
        resPololu[err] = local_2c;
        LeaveCriticalSection(PololuCS + err);
      } while (bExitPololu[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE PololuThread(void* pParam)
{
	POLOLU* pPololu = (POLOLU*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
	int value = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(valuesPololu, 0, NB_CHANNELS_POLOLU*sizeof(int));
	
	mSleep(pPololu->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&PololuCS[id]);
		memcpy(selectedchannels, selectedchannelsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		memcpy(pws, pwsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		LeaveCriticalSection(&PololuCS[id]);
		res = SetAllPWMsPololu(pPololu, selectedchannels, pws);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(10);
		if (pPololu->winddiranaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->winddiranaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->winddiranaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->windspeedanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->windspeedanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->windspeedanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->switchanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->switchanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->switchanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		EnterCriticalSection(&PololuCS[id]);
		resPololu[id] = err;
		LeaveCriticalSection(&PololuCS[id]);
		if (bExitPololu[id]) break;
	}

	return 0;
}